

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Unpack_external
              (char *datarep,void *inbuf,MPIABI_Aint insize,MPIABI_Aint *position,void *outbuf,
              int outcount,MPIABI_Datatype datatype)

{
  int iVar1;
  
  iVar1 = MPI_Unpack_external();
  return iVar1;
}

Assistant:

int MPIABI_Unpack_external(
  const char * datarep,
  const void * inbuf,
  MPIABI_Aint insize,
  MPIABI_Aint * position,
  void * outbuf,
  int outcount,
  MPIABI_Datatype datatype
) {
  return MPI_Unpack_external(
    datarep,
    inbuf,
    (MPI_Aint)(WPI_Aint)insize,
    (MPI_Aint *)(WPI_Aint *)position,
    outbuf,
    outcount,
    (MPI_Datatype)(WPI_Datatype)datatype
  );
}